

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

uint32_t __thiscall capnp::StructSchema::Field::getDefaultValueSchemaOffset(Field *this)

{
  uint32_t uVar1;
  Reader local_70;
  Reader local_40;
  Field *local_10;
  Field *this_local;
  
  local_10 = this;
  capnp::schema::Field::Reader::getSlot(&local_70,&this->proto);
  capnp::schema::Field::Slot::Reader::getDefaultValue(&local_40,&local_70);
  uVar1 = Schema::getSchemaOffset((Schema *)this,&local_40);
  return uVar1;
}

Assistant:

uint32_t StructSchema::Field::getDefaultValueSchemaOffset() const {
  return parent.getSchemaOffset(proto.getSlot().getDefaultValue());
}